

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall FailableMemoryAllocator::failAllocNumber(FailableMemoryAllocator *this,int number)

{
  int iVar1;
  undefined4 extraout_var;
  LocationToFailAllocNode *newNode;
  int number_local;
  FailableMemoryAllocator *this_local;
  
  iVar1 = (*(this->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[8])(this,0x20);
  LocationToFailAllocNode::failAtAllocNumber
            ((LocationToFailAllocNode *)CONCAT44(extraout_var,iVar1),number,this->head_);
  this->head_ = (LocationToFailAllocNode *)CONCAT44(extraout_var,iVar1);
  return;
}

Assistant:

void FailableMemoryAllocator::failAllocNumber(int number)
{
    LocationToFailAllocNode* newNode = (LocationToFailAllocNode*) (void*) allocMemoryLeakNode(sizeof(LocationToFailAllocNode));
    newNode->failAtAllocNumber(number, head_);
    head_ = newNode;
}